

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O0

_Bool borg_think_home_buy_useful(void)

{
  uint8_t uVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  borg_item_conflict *item_00;
  char *what;
  int local_4c;
  borg_item_conflict *item;
  _Bool skip_it;
  int32_t iStack_38;
  _Bool fix;
  int32_t p_right;
  int32_t p_left;
  int32_t b_p;
  int32_t p;
  int charge_each;
  int b_n;
  int n;
  int qty;
  int stack;
  int i;
  int slot;
  int hole;
  
  p = -1;
  b_p = 0;
  iStack_38 = 0;
  item._4_4_ = 0;
  bVar5 = false;
  p_right = borg.power;
  charge_each = 0;
  do {
    if ((int)(uint)z_info->store_inven_max <= charge_each) {
      if (bVar5) {
        borg_notice(true);
      }
      if ((p < 0) || (p_right <= borg.power)) {
        slot._3_1_ = false;
      }
      else {
        borg.goal.shop = 7;
        borg.goal.ware = (int16_t)p;
        slot._3_1_ = true;
      }
      return slot._3_1_;
    }
    item_00 = borg_shops[7].ware + charge_each;
    if (item_00->iqty != '\0') {
      bVar4 = false;
      for (qty = 0; qty < sold_item_num; qty = qty + 1) {
        if ((sold_item_tval[qty] == (uint)item_00->tval) &&
           (sold_item_sval[qty] == (uint)item_00->sval)) {
          if (*borg_cfg != 0) {
            what = format("# Choosing not to buy back \'%s\' from home.",item_00);
            borg_note(what);
          }
          bVar4 = true;
        }
      }
      if ((!bVar4) && (i = borg_first_empty_inventory_slot(), i != L'\xffffffff')) {
        if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
          b_p = (int)item_00->pval / (int)(uint)item_00->iqty;
        }
        iVar6 = borg_min_item_quantity(item_00);
        uVar1 = (uint8_t)iVar6;
        borg_shops[7].ware[charge_each].iqty = borg_shops[7].ware[charge_each].iqty - uVar1;
        sVar2 = (short)iVar6;
        sVar3 = (short)b_p;
        if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
          borg_shops[7].ware[charge_each].pval =
               borg_shops[7].ware[charge_each].pval - sVar2 * sVar3;
        }
        wVar7 = borg_wield_slot(item_00);
        wVar8 = borg_slot((uint)item_00->tval,(uint)item_00->sval);
        p_left = 0;
        if (L'\xffffffff' < wVar7) {
          if ((i == L'\xffffffff') ||
             ((int)((uint)z_info->pack_size - borg.trait[0x9e]) <= i + L'\x01')) goto LAB_002d3d6a;
          if (wVar7 == (uint)z_info->pack_size + L'\x03') {
            if ((borg_items[(int)(z_info->pack_size + 3)].one_ring & 1U) == 0) {
              memcpy(borg_items + i,safe_items + wVar7,0x388);
              memcpy(borg_items + wVar7,borg_safe_shops[7].ware + charge_each,0x388);
              borg_items[wVar7].iqty = '\x01';
              bVar5 = true;
              borg_notice(true);
              iStack_38 = borg_power();
              memcpy(borg_items + wVar7,safe_items + wVar7,0x388);
            }
            if ((borg_items[(int)(z_info->pack_size + 2)].one_ring & 1U) == 0) {
              memcpy(borg_items + i,safe_items + (int)(z_info->pack_size + 2),0x388);
              memcpy(borg_items + (int)(z_info->pack_size + 2),borg_safe_shops[7].ware + charge_each
                     ,0x388);
              borg_items[(int)(z_info->pack_size + 2)].iqty = uVar1;
              bVar5 = true;
              borg_notice(true);
              item._4_4_ = borg_power();
              memcpy(borg_items + (int)(z_info->pack_size + 2),
                     safe_items + (int)(z_info->pack_size + 2),0x388);
            }
            if (item._4_4_ < iStack_38) {
              local_4c = iStack_38;
            }
            else {
              local_4c = item._4_4_;
            }
            p_left = local_4c;
            memcpy(borg_items + i,safe_items + i,0x388);
          }
          else {
            memcpy(borg_items + i,safe_items + wVar7,0x388);
            memcpy(borg_items + wVar7,borg_safe_shops[7].ware + charge_each,0x388);
            borg_items[wVar7].iqty = uVar1;
            bVar5 = true;
            borg_notice(true);
            p_left = borg_power();
            memcpy(borg_items + wVar7,safe_items + wVar7,0x388);
          }
        }
        if (p_left <= p_right) {
          if (L'\xffffffff' < wVar7) {
            borg_items[i].iqty = '\0';
          }
          wVar7 = wVar8;
          if (((wVar8 == L'\xffffffff') && (wVar7 = i, i == L'\xffffffff')) ||
             ((i = wVar7, wVar8 == L'\xffffffff' &&
              ((int)((uint)z_info->pack_size - borg.trait[0x9e]) <= i + L'\x01'))))
          goto LAB_002d3d6a;
          memcpy(borg_items + i,borg_safe_shops[7].ware + charge_each,0x388);
          if (wVar8 == L'\xffffffff') {
            borg_items[i].iqty = uVar1;
            if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
              borg_items[i].pval = sVar2 * sVar3;
            }
          }
          else {
            borg_items[i].iqty = safe_items[i].iqty + uVar1;
            if ((item_00->tval == '\x16') || (item_00->tval == '\x17')) {
              borg_items[i].pval = borg_items[i].pval + sVar2 * sVar3;
            }
          }
          bVar5 = true;
          borg_notice(true);
          p_left = borg_power();
        }
        memcpy(borg_items + i,safe_items + i,0x388);
        memcpy(borg_shops[7].ware + charge_each,borg_safe_shops[7].ware + charge_each,0x388);
        if (p_right < p_left) {
          p = charge_each;
          p_right = p_left;
        }
      }
    }
LAB_002d3d6a:
    charge_each = charge_each + 1;
  } while( true );
}

Assistant:

bool borg_think_home_buy_useful(void)
{

    int     hole;
    int     slot, i;
    int     stack;
    int     qty = 1;
    int     n, b_n = -1;
    int     charge_each = 0;
    int32_t p, b_p = 0L;
    int32_t p_left  = 0;
    int32_t p_right = 0;

    bool fix        = false;
    bool skip_it    = false;

    /* Extract the "power" */
    b_p = borg.power;

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip it if I just sold it */
        skip_it = false;
        for (i = 0; i < sold_item_num; i++) {
            if (sold_item_tval[i] == item->tval
                && sold_item_sval[i] == item->sval) {
                if (borg_cfg[BORG_VERBOSE])
                    borg_note(
                        format("# Choosing not to buy back '%s' from home.",
                            item->desc));
                skip_it = true;
            }
        }
        if (skip_it == true)
            continue;

        /* Reset the 'hole' in case it was changed by the last stacked item.*/
        hole = borg_first_empty_inventory_slot();
        if (hole == -1)
            continue;

        /* borg_note(format("# Considering buying (%d)'%s' (pval=%d) from
         * home.", item->iqty,item->desc, item->pval)); */

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            charge_each = item->pval / item->iqty;

        /* Save the number */
        qty = borg_min_item_quantity(item);

        /* Remove one item from shop (sometimes) */
        borg_shops[BORG_HOME].ware[n].iqty -= qty;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            borg_shops[BORG_HOME].ware[n].pval -= (qty * charge_each);

        /* Obtain "slot" */
        slot  = borg_wield_slot(item);
        stack = borg_slot(item->tval, item->sval);

        /* Consider new equipment-- Must check both ring slots */
        p = 0;
        if (slot >= 0) {
            /* Require two empty slots */
            if (hole == -1)
                continue;
            if ((hole + 1) >= PACK_SLOTS)
                continue;

            /* Check Rings */
            if (slot == INVEN_LEFT) {
                /** First Check Left Hand **/

                /* special curse check for left ring */
                if (!borg_items[INVEN_LEFT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[slot],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[slot],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[slot].iqty = 1;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_left = borg_power();
#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p_left));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[slot], &safe_items[slot],
                        sizeof(borg_item));
                }

                /** Second Check Right Hand **/
                /* special curse check for right ring */
                if (!borg_items[INVEN_RIGHT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[INVEN_RIGHT],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[INVEN_RIGHT].iqty = qty;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_right = borg_power();

#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[INVEN_RIGHT].desc, p_right));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[INVEN_RIGHT].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[INVEN_RIGHT], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));
                }

                /* Is this ring better than one of mine? */
                p = MAX(p_right, p_left);

                /* Restore hole */
                memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));
            }

            else /* non rings */
            {
                /* Move equipment into inventory */
                memcpy(&borg_items[hole], &safe_items[slot], sizeof(borg_item));

                /* Move new item into equipment */
                memcpy(&borg_items[slot], &borg_safe_shops[BORG_HOME].ware[n],
                    sizeof(borg_item));

                /* Only a single item */
                borg_items[slot].iqty = qty;

                /* Fix later */
                fix = true;

                /* Examine the inventory */
                borg_notice(true);

                /* Evaluate the inventory */
                p = borg_power();
#if 0
                /* dump list and power...  for debugging */
                borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p));
                borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                /* Restore old item */
                memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));
            } /* non rings */
        } /* equip */

        /* Consider new inventory.*/
        /* note, we may grab an equip able if, for example, we want to ID it */
        if (p <= b_p) {
            /* Restore hole if we are trying an item in inventory that didn't
             * work equipped */
            if (slot >= 0)
                borg_items[hole].iqty = 0;

            if (stack != -1)
                hole = stack;

            /* Require two empty slots */
            if (stack == -1 && hole == -1)
                continue;
            if (stack == -1 && (hole + 1) >= PACK_SLOTS)
                continue;

            /* Move new item into inventory */
            memcpy(&borg_items[hole], &borg_safe_shops[BORG_HOME].ware[n],
                sizeof(borg_item));

            /* Is this new item merging into an existing stack? */
            if (stack != -1) {
                /* Add a quantity to the stack */
                borg_items[hole].iqty = safe_items[hole].iqty + qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval += (qty * charge_each);

            } else {
                /* Only a single item */
                borg_items[hole].iqty = qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval = (qty * charge_each);
            }

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the equipment */
            p = borg_power();
        }

        /* Restore hole */
        memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n],
            &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

        /* Ignore "silly" purchases */
        if (p <= b_p)
            continue;

        /* Save the item and cost */
        b_n = n;
        b_p = p;
    }

    /* Examine the inventory */
    if (fix)
        borg_notice(true);

    /* Buy something */
    if ((b_n >= 0) && (b_p > borg.power)) {
        /* Go to the home */
        borg.goal.shop = BORG_HOME;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Nope */
    return false;
}